

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::set_slice_var_parent(Var **var,Var *target,Var *new_var,bool check_target)

{
  bool bVar1;
  VarType VVar2;
  element_type *peVar3;
  InternalException *pIVar4;
  iterator __first;
  iterator __last;
  element_type *peVar5;
  shared_ptr<kratos::Var> local_128;
  shared_ptr<kratos::Var> local_118;
  __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_108;
  shared_ptr<kratos::VarSlice> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *__range1;
  undefined1 local_d8 [8];
  shared_ptr<kratos::Var> new_var_ptr;
  string local_c0;
  undefined1 local_a0 [8];
  string local_98;
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  slices;
  Var *parent_var;
  shared_ptr<kratos::VarSlice> slice;
  bool check_target_local;
  Var *new_var_local;
  Var *target_local;
  Var **var_local;
  
  slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       check_target;
  std::shared_ptr<kratos::VarSlice>::shared_ptr((shared_ptr<kratos::VarSlice> *)&parent_var);
  slices.
  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*var;
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
          *)local_58);
  while( true ) {
    VVar2 = Var::type((Var *)slices.
                             super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (VVar2 != Slice) break;
    Var::as<kratos::VarSlice>((Var *)local_78);
    std::shared_ptr<kratos::VarSlice>::operator=
              ((shared_ptr<kratos::VarSlice> *)&parent_var,(shared_ptr<kratos::VarSlice> *)local_78)
    ;
    std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)local_78);
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::emplace_back<std::shared_ptr<kratos::VarSlice>&>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)local_58,(shared_ptr<kratos::VarSlice> *)&parent_var);
    peVar3 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&parent_var);
    slices.
    super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)peVar3->parent_var;
  }
  if ((Var *)slices.
             super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == target) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&parent_var);
    if (!bVar1) {
      new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_1_ = 1;
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Slice cannot be null",
                 (allocator<char> *)
                 ((long)&new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      InternalException::InternalException(pIVar4,&local_c0);
      new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_1_ = 0;
      __cxa_throw(pIVar4,&InternalException::typeinfo,InternalException::~InternalException);
    }
    Var::as<kratos::Var>((Var *)local_d8);
    __first = std::
              vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
              ::begin((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                       *)local_58);
    __last = std::
             vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ::end((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                    *)local_58);
    std::
    reverse<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarSlice>*,std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>>>
              ((__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                )__last._M_current);
    __end1 = std::
             vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ::begin((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                      *)local_58);
    s = (shared_ptr<kratos::VarSlice> *)
        std::
        vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
        ::end((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               *)local_58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                                  *)&s);
      if (!bVar1) break;
      local_108 = (__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )__gnu_cxx::
                   __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                   ::operator*(&__end1);
      peVar3 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_108);
      std::shared_ptr<kratos::Var>::shared_ptr(&local_128,(shared_ptr<kratos::Var> *)local_d8);
      (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1e])(&local_118,peVar3,&local_128);
      std::shared_ptr<kratos::Var>::operator=((shared_ptr<kratos::Var> *)local_d8,&local_118);
      std::shared_ptr<kratos::Var>::~shared_ptr(&local_118);
      std::shared_ptr<kratos::Var>::~shared_ptr(&local_128);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
      ::operator++(&__end1);
    }
    peVar5 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    *var = peVar5;
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_d8);
    local_a0._0_4_ = 0;
  }
  else {
    if ((slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _7_1_ & 1) != 0) {
      local_a0[6] = '\x01';
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Target not found",(allocator<char> *)(local_a0 + 7));
      InternalException::InternalException(pIVar4,&local_98);
      local_a0[6] = '\0';
      __cxa_throw(pIVar4,&InternalException::typeinfo,InternalException::~InternalException);
    }
    local_a0._0_4_ = 1;
  }
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           *)local_58);
  std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)&parent_var);
  return;
}

Assistant:

void set_slice_var_parent(Var *&var, Var *target, Var *new_var, bool check_target) {
    std::shared_ptr<VarSlice> slice;
    Var *parent_var = var;
    std::vector<std::shared_ptr<VarSlice>> slices;
    while (parent_var->type() == VarType::Slice) {
        // this is for nested slicing
        slice = parent_var->as<VarSlice>();
        slices.emplace_back(slice);
        parent_var = slice->parent_var;
    }
    if (parent_var != target) {
        if (check_target)
            throw InternalException("Target not found");
        else
            return;
    }
    if (!slice) throw InternalException("Slice cannot be null");

    auto new_var_ptr = new_var->as<Var>();
    std::reverse(slices.begin(), slices.end());
    for (auto const &s : slices) {
        new_var_ptr = s->slice_var(new_var_ptr);
    }
    var = new_var_ptr.get();
}